

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentRefList::Internal_CopyFrom
          (ON_SubDComponentRefList *this,ON_SubDComponentRefList *src)

{
  ON_SubDComponentRef **ppOVar1;
  ON_SubDComponentRef *this_00;
  ON_SubDComponentRef *local_38;
  ON_SubDComponentRef *local_30;
  ON_SubDComponentRef *local_28;
  ON_SubDComponentRef *p;
  uint i;
  uint count;
  ON_SubDComponentRefList *src_local;
  ON_SubDComponentRefList *this_local;
  
  _i = src;
  src_local = this;
  p._4_4_ = ON_SimpleArray<ON_SubDComponentRef_*>::UnsignedCount(&src->m_list);
  ON_SimpleArray<ON_SubDComponentRef_*>::Reserve(&this->m_list,(ulong)p._4_4_);
  ON_SimpleArray<ON_SubDComponentRef_*>::SetCount(&this->m_list,0);
  for (p._0_4_ = 0; (uint)p < p._4_4_; p._0_4_ = (uint)p + 1) {
    ppOVar1 = ON_SimpleArray<ON_SubDComponentRef_*>::operator[](&_i->m_list,(uint)p);
    local_28 = *ppOVar1;
    if (local_28 == (ON_SubDComponentRef *)0x0) {
      local_30 = (ON_SubDComponentRef *)0x0;
      ON_SimpleArray<ON_SubDComponentRef_*>::Append(&this->m_list,&local_30);
    }
    else {
      this_00 = (ON_SubDComponentRef *)operator_new(0x40);
      ON_SubDComponentRef::ON_SubDComponentRef(this_00,local_28);
      local_38 = this_00;
      ON_SimpleArray<ON_SubDComponentRef_*>::Append(&this->m_list,&local_38);
    }
    this->m_subd_count = _i->m_subd_count;
    this->m_subd_vertex_smooth_count = _i->m_subd_vertex_smooth_count;
    this->m_subd_vertex_dart_count = _i->m_subd_vertex_dart_count;
    this->m_subd_vertex_crease_count = _i->m_subd_vertex_crease_count;
    this->m_subd_vertex_corner_count = _i->m_subd_vertex_corner_count;
    this->m_subd_edge_smooth_count = _i->m_subd_edge_smooth_count;
    this->m_subd_edge_crease_count = _i->m_subd_edge_crease_count;
    this->m_subd_face_count = _i->m_subd_face_count;
    this->m_bIsClean = (bool)(_i->m_bIsClean & 1);
  }
  return;
}

Assistant:

void ON_SubDComponentRefList::Internal_CopyFrom(const ON_SubDComponentRefList& src)
{
  const unsigned int count = src.m_list.UnsignedCount();
  m_list.Reserve(count);
  m_list.SetCount(0);
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDComponentRef* p = src.m_list[i];
    if (nullptr == p)
      m_list.Append(nullptr);
    else
      m_list.Append(new ON_SubDComponentRef(*p));

    m_subd_count = src.m_subd_count;
    m_subd_vertex_smooth_count = src.m_subd_vertex_smooth_count;
    m_subd_vertex_dart_count = src.m_subd_vertex_dart_count;
    m_subd_vertex_crease_count = src.m_subd_vertex_crease_count;
    m_subd_vertex_corner_count = src.m_subd_vertex_corner_count;
    m_subd_edge_smooth_count = src.m_subd_edge_smooth_count;
    m_subd_edge_crease_count = src.m_subd_edge_crease_count;
    m_subd_face_count = src.m_subd_face_count;

    m_bIsClean = src.m_bIsClean;
  }
}